

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void ui_keymap_create(char *title,wchar_t row)

{
  _Bool _Var1;
  unkuint9 Var2;
  _Bool _Var3;
  ulong uVar4;
  uint8_t uVar11;
  uint8_t attr;
  bool bVar5;
  wchar_t row_00;
  undefined5 uVar12;
  char *pcVar6;
  long lVar7;
  long lVar8;
  keypress kVar9;
  keypress kVar10;
  char tmp [1024];
  char local_438 [1032];
  
  _Var1 = (player->opts).opt[1];
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar9 = keymap_get_trigger();
  if (kVar9.code == 0x3d) {
    c_prt('\f',"The \'=\' key is reserved.",L'\x10',L'\x02');
    pcVar6 = "Press any key to continue.";
    row_00 = L'\x12';
  }
  else {
    bVar5 = false;
    lVar7 = 0;
    do {
      attr = '\x01';
      if (lVar7 == 0) {
        attr = '\v';
      }
      keypress_to_text(local_438,0x400,keymap_buffer,false);
      if (lVar7 == 0x14) {
        attr = '\f';
      }
      pcVar6 = format("Action: %s",local_438);
      c_prt(attr,pcVar6,L'\x0f',L'\0');
      c_prt('\x0e',"  Press \'=\' when finished.",L'\x11',L'\0');
      c_prt('\x0e',"  Use \'CTRL-u\' to reset.",L'\x12',L'\0');
      pcVar6 = format("(Maximum keymap length is %d keys.)",0x14);
      c_prt('\x0e',pcVar6,L'\x13',L'\0');
      kVar10 = inkey();
      uVar4 = kVar10._0_8_;
      if (uVar4 >> 0x20 == 0x3d) {
        bVar5 = true;
        lVar8 = lVar7;
      }
      else if (kVar10.code - 0x9e < 2) {
        if (lVar7 == 0) {
LAB_001e329a:
          lVar8 = 0;
        }
        else {
          lVar8 = lVar7 + -1;
          keymap_buffer[lVar8].mods = '\0';
          keymap_buffer[lVar8].type = EVT_NONE;
          keymap_buffer[lVar8].code = 0;
        }
      }
      else {
        if (kVar10.code == 0x15) {
          memset(keymap_buffer,0,0xfc);
          goto LAB_001e329a;
        }
        if (lVar7 == 0x14) {
          lVar8 = 0x14;
        }
        else {
          if (lVar7 == 0) {
            memset(keymap_buffer,0,0xfc);
          }
          lVar8 = lVar7 + 1;
          keymap_buffer[lVar7].type = (int)uVar4;
          keymap_buffer[lVar7].code = (int)(uVar4 >> 0x20);
          keymap_buffer[lVar7].mods = kVar10.mods;
        }
      }
      lVar7 = lVar8;
    } while (!bVar5);
    if (kVar9._0_8_ >> 0x20 == 0) {
      return;
    }
    _Var3 = get_check("Keep this keymap? ");
    if (!_Var3) {
      return;
    }
    Var2 = kVar9._0_9_;
    kVar9._9_3_ = 0;
    kVar9.type = (int)Var2;
    register0x00000034 = (int)(Var2 >> 0x20);
    register0x00000010 = (char)(Var2 >> 0x40);
    keymap_add((uint)_Var1,kVar9,keymap_buffer,true);
    pcVar6 = "To use in other sessions, save the keymaps to a file.  Press a key to continue.";
    row_00 = L'\x11';
  }
  prt(pcVar6,row_00,L'\0');
  inkey();
  return;
}

Assistant:

static void ui_keymap_create(const char *title, int row)
{
	bool done = false;
	size_t n = 0;

	struct keypress c;
	char tmp[1024];
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);

	c = keymap_get_trigger();
	if (c.code == '=') {
		c_prt(COLOUR_L_RED, "The '=' key is reserved.", 16, 2);
		prt("Press any key to continue.", 18, 0);
		inkey();
		return;
	}

	/* Get an encoded action, with a default response */
	while (!done) {
		struct keypress kp = {EVT_NONE, 0, 0};

		int color = COLOUR_WHITE;
		if (n == 0) color = COLOUR_YELLOW;
		if (n == KEYMAP_ACTION_MAX) color = COLOUR_L_RED;

		keypress_to_text(tmp, sizeof(tmp), keymap_buffer, false);
		c_prt(color, format("Action: %s", tmp), 15, 0);

		c_prt(COLOUR_L_BLUE, "  Press '=' when finished.", 17, 0);
		c_prt(COLOUR_L_BLUE, "  Use 'CTRL-u' to reset.", 18, 0);
		c_prt(COLOUR_L_BLUE, format("(Maximum keymap length is %d keys.)",
									KEYMAP_ACTION_MAX), 19, 0);

		kp = inkey();

		if (kp.code == '=') {
			done = true;
			continue;
		}

		switch (kp.code) {
			case KC_DELETE:
			case KC_BACKSPACE: {
				if (n > 0) {
					n -= 1;
				    keymap_buffer[n].type = 0;
					keymap_buffer[n].code = 0;
					keymap_buffer[n].mods = 0;
				}
				break;
			}

			case KTRL('U'): {
				memset(keymap_buffer, 0, sizeof keymap_buffer);
				n = 0;
				break;
			}

			default: {
				if (n == KEYMAP_ACTION_MAX) continue;

				if (n == 0) {
					memset(keymap_buffer, 0, sizeof keymap_buffer);
				}
				keymap_buffer[n++] = kp;
				break;
			}
		}
	}

	if (c.code && get_check("Keep this keymap? ")) {
		keymap_add(mode, c, keymap_buffer, true);
		prt("To use in other sessions, save the keymaps to a file.  Press a key to continue.", 17, 0);
		inkey();
	}
}